

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

bool bssl::anon_unknown_0::InstallECHConfigList(SSL *client,SSL_ECH_KEYS *keys)

{
  int iVar1;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_38;
  UniquePtr<uint8_t> free_ech_config_list;
  size_t ech_config_list_len;
  uint8_t *ech_config_list;
  SSL_ECH_KEYS *keys_local;
  SSL *client_local;
  
  ech_config_list = (uint8_t *)keys;
  keys_local = (SSL_ECH_KEYS *)client;
  iVar1 = SSL_ECH_KEYS_marshal_retry_configs
                    (keys,(uint8_t **)&ech_config_list_len,(size_t *)&free_ech_config_list);
  if (iVar1 == 0) {
    client_local._7_1_ = 0;
  }
  else {
    std::unique_ptr<unsigned_char,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&local_38,
               (pointer)ech_config_list_len);
    iVar1 = SSL_set1_ech_config_list
                      ((SSL *)keys_local,(uint8_t *)ech_config_list_len,
                       (size_t)free_ech_config_list._M_t.
                               super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    client_local._7_1_ = iVar1 != 0;
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  }
  return (bool)(client_local._7_1_ & 1);
}

Assistant:

static bool InstallECHConfigList(SSL *client, const SSL_ECH_KEYS *keys) {
  uint8_t *ech_config_list;
  size_t ech_config_list_len;
  if (!SSL_ECH_KEYS_marshal_retry_configs(keys, &ech_config_list,
                                          &ech_config_list_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_ech_config_list(ech_config_list);
  return SSL_set1_ech_config_list(client, ech_config_list, ech_config_list_len);
}